

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TypeChecker.cpp
# Opt level: O2

void __thiscall TypeChecker::visit(TypeChecker *this,VariableNode *node)

{
  _Storage<std::reference_wrapper<Symbol>,_true> _Var1;
  optional<std::reference_wrapper<Symbol>_> oVar2;
  VariableAnalyser analyser;
  FunctionAnalyser analyser_1;
  string name;
  allocator<char> local_a1;
  VariableAnalyser local_a0;
  FunctionAnalyser local_88;
  string local_58;
  string local_38;
  
  std::__cxx11::string::string((string *)&local_38,(string *)&node->name_);
  oVar2 = SymbolTable::lookup(this->symbols_,&local_38,0);
  _Var1 = oVar2.super__Optional_base<std::reference_wrapper<Symbol>,_true,_true>._M_payload.
          super__Optional_payload_base<std::reference_wrapper<Symbol>_>._M_payload;
  if (((undefined1  [16])
       oVar2.super__Optional_base<std::reference_wrapper<Symbol>,_true,_true>._M_payload.
       super__Optional_payload_base<std::reference_wrapper<Symbol>_> & (undefined1  [16])0x1) ==
      (undefined1  [16])0x0) {
    std::__throw_bad_optional_access();
  }
  VariableAnalyser::VariableAnalyser(&local_a0);
  (**(code **)(*(long *)_Var1 + 0x10))(_Var1,&local_a0);
  if (local_a0.symbolValid_ == true) {
    if (((ulong)local_a0.type_.super__Optional_base<TypeName,_true,_true>._M_payload.
                super__Optional_payload_base<TypeName> >> 0x20 & 1) == 0) {
      std::__throw_bad_optional_access();
    }
    (this->type_).super__Optional_base<TypeName,_true,_true>._M_payload.
    super__Optional_payload_base<TypeName> =
         (_Optional_payload_base<TypeName>)
         ((ulong)local_a0.type_.super__Optional_base<TypeName,_true,_true>._M_payload.
                 super__Optional_payload_base<TypeName> & 0x1ffffffff);
  }
  else {
    FunctionAnalyser::FunctionAnalyser(&local_88);
    (**(code **)(*(long *)_Var1 + 0x10))(_Var1,&local_88);
    if (local_88.symbolValid_ != true) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_58,"Invalid symbol reference!",&local_a1);
      reportError(&local_58,(Node *)node);
    }
    (this->type_).super__Optional_base<TypeName,_true,_true>._M_payload.
    super__Optional_payload_base<TypeName> = (_Optional_payload_base<TypeName>)0x100000001;
    FunctionAnalyser::~FunctionAnalyser(&local_88);
  }
  std::__cxx11::string::~string((string *)&local_38);
  return;
}

Assistant:

void TypeChecker::visit(const VariableNode& node)
{
  auto name = node.getName();
  auto& symbol = symbols_.lookup(name).value().get();
  VariableAnalyser analyser{};
  symbol.accept(analyser);
  if(analyser.isSymbolValid())
    type_ = analyser.getType().value();
  else
  {
    FunctionAnalyser analyser{};
    symbol.accept(analyser);
    if(analyser.isSymbolValid())
      type_ = TypeName::Function;
    else
      reportError("Invalid symbol reference!", node);
  }
}